

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_tcache_bin_flush_stashed
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,_Bool is_small)

{
  witness_t **ppwVar1;
  locked_u64_t *plVar2;
  ticker_geom_t *ptVar3;
  uint64_t *puVar4;
  ulong *puVar5;
  long *plVar6;
  byte bVar7;
  char cVar8;
  ushort uVar9;
  undefined2 uVar10;
  uint uVar11;
  undefined8 uVar12;
  void *pvVar13;
  uint64_t uVar14;
  edata_t *peVar15;
  szind_t sVar16;
  malloc_mutex_t *pmVar17;
  void **ppvVar18;
  cache_bin_t *pcVar19;
  arena_t *arena;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  size_t sVar26;
  bin_t *mutex;
  undefined8 *puVar27;
  size_t sVar28;
  pthread_mutex_t *ppVar29;
  ulong uVar30;
  long lVar31;
  mutex_prof_data_t *data_1;
  ulong uVar32;
  bin_remote_free_data_t *pbVar33;
  arena_stats_large_t *paVar34;
  edata_t *peVar35;
  ushort uVar36;
  void **ptrs;
  emap_batch_lookup_result_t *peVar37;
  undefined7 in_register_00000081;
  pthread_mutex_t *ppVar38;
  arena_t *paVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint i;
  edata_t *peVar44;
  uint uVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  undefined8 uStack_220;
  undefined1 local_218 [8];
  bin_remote_free_data_t remote_free_data [16];
  cache_bin_ptr_array_t local_c0;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  cache_bin_t *local_90;
  ulong local_88;
  arena_t *local_80;
  ulong local_78;
  szind_t local_70;
  uint local_6c;
  emap_batch_lookup_result_t *local_68;
  arena_t *local_60;
  uint local_54;
  edata_t *local_50;
  arena_stats_large_t *lstats;
  arena_t *local_40;
  pthread_mutex_t *local_38;
  
  ppVar38 = (pthread_mutex_t *)CONCAT71(in_register_00000081,is_small);
  uVar9 = (cache_bin->bin_info).ncached_max;
  uVar36 = (uVar9 * 8 - (short)*(int *)&cache_bin->low_bits_empty) + cache_bin->low_bits_full;
  if (7 < uVar36) {
    uVar36 = uVar36 >> 3;
    ptrs = (void **)((long)cache_bin->stack_head +
                    (ulong)uVar9 * -8 +
                    (ulong)(*(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff
                           ));
    uVar46 = (ulong)binind;
    local_70 = binind;
    duckdb_je_san_check_stashed_ptrs(ptrs,(ulong)uVar36,duckdb_je_sz_index2size_tab[uVar46]);
    uVar32 = 0;
    local_a0 = uVar46;
    local_90 = cache_bin;
    lstats = (arena_stats_large_t *)tsd;
    do {
      uVar45 = (uint)uVar36;
      uVar41 = (uint)uVar32;
      uVar42 = uVar45 - uVar41;
      if (0xff < uVar45 - uVar41) {
        uVar42 = 0x100;
      }
      local_78 = (ulong)uVar42;
      local_c0.n = (cache_bin_sz_t)uVar42;
      local_c0.ptr = ptrs + uVar32;
      local_80 = tcache->tcache_slow->arena;
      if (is_small) {
        bVar7 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
                [local_a0];
        uVar32 = (ulong)uVar42 * 8 + 0x17 & 0xfffffffffffffff0;
        lVar24 = -uVar32;
        paVar39 = (arena_t *)((long)remote_free_data + lVar24 + -8);
        local_40 = paVar39;
        *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a42b9;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_c0,uVar42,(size_t)paVar39,(emap_batch_lookup_result_t *)ppVar38);
        lVar24 = (long)paVar39 - uVar32;
        local_b0 = lVar24;
        if (uVar45 == uVar41) {
          local_50 = (edata_t *)0x0;
          local_88 = 0;
          uVar22 = 0;
        }
        else {
          iVar23 = (int)local_78;
          local_88 = 0;
          uVar42 = 0;
          local_54 = 0;
          peVar44 = (edata_t *)0x0;
          do {
            sVar16 = duckdb_je_bin_info_nbatched_sizes;
            uVar32 = (ulong)uVar42;
            uVar22 = (uint)**(undefined8 **)(local_40->nthreads + uVar32 * 2);
            local_60 = (arena_t *)duckdb_je_arenas[uVar22 & 0xfff].repr;
            if (local_60 == (arena_t *)0x0) {
              local_60 = (arena_t *)0x0;
            }
            uVar20 = (uint)((ulong)**(undefined8 **)(local_40->nthreads + uVar32 * 2) >> 0x26) &
                     0x3f;
            local_98 = CONCAT44(local_98._4_4_,duckdb_je_bin_info_nbatched_sizes);
            peVar37 = (emap_batch_lookup_result_t *)(ulong)(uVar20 << 8);
            if (local_70 < duckdb_je_bin_info_nbatched_sizes) {
              peVar37 = (emap_batch_lookup_result_t *)((ulong)uVar20 * 0x288);
            }
            uVar11 = duckdb_je_arena_bin_offsets[local_a0];
            uVar43 = uVar42 + 1;
            uVar30 = (ulong)uVar43;
            if (uVar43 < (uint)local_78) {
              uVar25 = (ulong)uVar43;
              lVar40 = 0;
              do {
                if ((((uVar22 ^ (uint)**(undefined8 **)
                                        (local_40->nthreads + uVar25 * 2 + lVar40 * 2)) & 0xfff) ==
                     0) && (((uint)((ulong)**(undefined8 **)
                                             (local_40->nthreads + uVar25 * 2 + lVar40 * 2) >> 0x26)
                            & 0x3f) == uVar20)) {
                  uVar12 = *(undefined8 *)(local_40->nthreads + uVar30 * 2);
                  *(undefined8 *)(local_40->nthreads + uVar30 * 2) =
                       *(undefined8 *)(local_40->nthreads + uVar25 * 2 + lVar40 * 2);
                  *(undefined8 *)(local_40->nthreads + uVar25 * 2 + lVar40 * 2) = uVar12;
                  pvVar13 = local_c0.ptr[uVar30];
                  local_c0.ptr[uVar30] = local_c0.ptr[uVar25 + lVar40];
                  local_c0.ptr[uVar25 + lVar40] = pvVar13;
                  uVar30 = (ulong)((int)uVar30 + 1);
                }
                uVar43 = (uint)uVar30;
                lVar40 = lVar40 + 1;
              } while ((iVar23 + -1) - uVar42 != (int)lVar40);
            }
            ppVar38 = (pthread_mutex_t *)
                      ((long)&local_60->nthreads[0].repr + (ulong)uVar11 + (long)peVar37);
            bVar51 = sVar16 <= local_70;
            bVar48 = local_60 == local_80;
            local_a8 = (ulong)(uVar43 - uVar42);
            bVar47 = duckdb_je_opt_bin_info_remote_free_max_batch < local_a8;
            bVar49 = uVar20 == bVar7;
            local_68 = peVar37;
            local_50 = peVar44;
            if ((bVar49 && bVar48 || bVar51) || bVar47) {
              bVar50 = false;
            }
            else {
              local_38 = (pthread_mutex_t *)(ulong)uVar11;
              *(undefined8 *)(lVar24 + -8) = 0x11a46f7;
              iVar21 = pthread_mutex_trylock((pthread_mutex_t *)((long)ppVar38 + 0x48));
              bVar50 = iVar21 == 0;
              if ((bVar50) &&
                 (((emap_batch_lookup_result_t *)((long)ppVar38 + 0x38))->edata =
                       (edata_t *)
                       ((long)&((emap_batch_lookup_result_t *)((long)ppVar38 + 0x38))->edata->e_bits
                       + 1),
                 ((emap_batch_lookup_result_t *)((long)ppVar38 + 0x30))->edata != (edata_t *)lstats)
                 ) {
                ((emap_batch_lookup_result_t *)((long)ppVar38 + 0x30))->edata = (edata_t *)lstats;
                ppVar38[1].__align = (long)((long)&((edata_t *)ppVar38[1].__align)->e_bits + 1);
              }
            }
            paVar34 = lstats;
            uVar30 = local_a8;
            local_6c = uVar43;
            local_38 = ppVar38;
            if ((bool)(((bVar49 && bVar48 || bVar51) || bVar47) | bVar50)) {
              bVar47 = false;
              bVar51 = false;
            }
            else {
              local_68 = (emap_batch_lookup_result_t *)((long)ppVar38 + 0x100);
              *(undefined8 *)(lVar24 + -8) = 0x11a4759;
              sVar26 = duckdb_je_batcher_push_begin
                                 ((tsdn_t *)paVar34,(batcher_t *)((long)ppVar38 + 0x100),uVar30);
              paVar34 = lstats;
              peVar37 = local_68;
              bVar51 = sVar26 != 0xffffffffffffffff;
              if (bVar51) {
                if (local_6c != uVar42) {
                  puVar27 = (undefined8 *)((long)local_38 + sVar26 * 0x10 + 400);
                  uVar30 = local_a8;
                  uVar22 = uVar42;
                  do {
                    puVar27[-1] = local_c0.ptr[uVar22];
                    *puVar27 = *(undefined8 *)(local_40->nthreads + (ulong)uVar22 * 2);
                    uVar22 = uVar22 + 1;
                    puVar27 = puVar27 + 2;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                *(undefined8 *)(lVar24 + -8) = 0x11a47bf;
                batcher_push_end((tsdn_t *)paVar34,(batcher_t *)peVar37);
              }
              bVar47 = sVar26 == 0xffffffffffffffff;
            }
            pcVar19 = local_90;
            paVar34 = lstats;
            ppVar38 = local_38;
            peVar44 = local_50;
            uVar22 = local_6c;
            if (!bVar51) {
              if (!bVar50) {
                ppVar38 = (pthread_mutex_t *)((long)local_38 + 0x48);
                *(undefined8 *)(lVar24 + -8) = 0x11a47fb;
                iVar21 = pthread_mutex_trylock(ppVar38);
                ppVar38 = local_38;
                if (iVar21 != 0) {
                  *(undefined8 *)(lVar24 + -8) = 0x11a480b;
                  duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&ppVar38->__data);
                  *(undefined1 *)((long)local_38 + 0x40) = 1;
                }
                ((emap_batch_lookup_result_t *)((long)local_38 + 0x38))->edata =
                     (edata_t *)
                     ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x38))->edata->e_bits
                     + 1);
                if (((emap_batch_lookup_result_t *)((long)local_38 + 0x30))->edata !=
                    (edata_t *)lstats) {
                  ((emap_batch_lookup_result_t *)((long)local_38 + 0x30))->edata = (edata_t *)lstats
                  ;
                  local_38[1].__align = (long)((long)&((edata_t *)local_38[1].__align)->e_bits + 1);
                }
              }
              uVar22 = local_6c;
              if (bVar47) {
                local_38[5].__align = (long)((long)&((edata_t *)local_38[5].__align)->e_bits + 1);
              }
              if ((local_60 == local_80) && ((local_88 & 1) == 0)) {
                ((emap_batch_lookup_result_t *)((long)local_38 + 0x98))->edata =
                     (edata_t *)
                     ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x98))->edata->e_bits
                     + 1);
                uVar14 = (pcVar19->tstats).nrequests;
                ((emap_batch_lookup_result_t *)((long)local_38 + 0x80))->edata =
                     (edata_t *)
                     ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x80))->edata->e_bits
                     + uVar14);
                (pcVar19->tstats).nrequests = 0;
                local_88 = CONCAT71((int7)(uVar14 >> 8),1);
              }
              local_68 = (emap_batch_lookup_result_t *)
                         (ulong)duckdb_je_arena_binind_div_info[local_a0].magic;
              ppVar38 = local_38;
              if (uVar42 < local_6c) {
                uVar42 = ~uVar42 + local_6c;
                uVar30 = (ulong)local_6c;
                paVar39 = local_40;
                do {
                  paVar34 = lstats;
                  arena = local_60;
                  peVar44 = *(edata_t **)(paVar39->nthreads + uVar32 * 2);
                  uVar25 = ((long)local_c0.ptr[uVar32] - (long)peVar44->e_addr) * (long)local_68;
                  puVar5 = (ulong *)((long)&peVar44->field_6 + (uVar25 >> 0x26) * 8);
                  *puVar5 = *puVar5 ^ 1L << ((byte)(uVar25 >> 0x20) & 0x3f);
                  uVar25 = peVar44->e_bits + 0x10000000;
                  peVar44->e_bits = uVar25;
                  uVar20 = (uint)(uVar25 >> 0x1c) & 0x3ff;
                  if (uVar20 == duckdb_je_bin_infos[uVar46].nregs) {
                    *(undefined8 *)(lVar24 + -8) = 0x11a48fe;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                              ((tsdn_t *)paVar34,arena,peVar44,(bin_t *)&ppVar38->__data);
                    ppVar38 = local_38;
                    paVar39 = local_40;
                    if (local_54 < (uint)local_78) {
                      *(edata_t **)(local_b0 + (ulong)local_54 * 8) = peVar44;
                      local_54 = local_54 + 1;
                    }
                    else {
                      (peVar44->field_5).ql_link_active.qre_next = peVar44;
                      (peVar44->field_5).ql_link_active.qre_prev = peVar44;
                      if (local_50 != (edata_t *)0x0) {
                        (peVar44->field_5).ql_link_active.qre_next =
                             (local_50->field_5).ql_link_active.qre_prev;
                        (local_50->field_5).ql_link_active.qre_prev = peVar44;
                        (peVar44->field_5).ql_link_active.qre_prev =
                             (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                             qre_next;
                        (((local_50->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = local_50;
                        (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = peVar44;
                      }
                      local_50 = (peVar44->field_5).ql_link_active.qre_next;
                    }
                  }
                  else if ((uVar20 == 1) &&
                          (((emap_batch_lookup_result_t *)((long)ppVar38 + 0xe0))->edata != peVar44)
                          ) {
                    *(undefined8 *)(lVar24 + -8) = 0x11a493b;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                              ((tsdn_t *)paVar34,arena,peVar44,(bin_t *)&ppVar38->__data);
                    ppVar38 = local_38;
                    paVar39 = local_40;
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar30 != uVar32);
                lVar40 = (ulong)uVar42 + 1;
              }
              else {
                lVar40 = 0;
              }
              paVar34 = lstats;
              if (local_70 < (uint)local_98) {
                peVar37 = (emap_batch_lookup_result_t *)((long)ppVar38 + 0x100);
                *(undefined8 *)(lVar24 + -8) = 0x11a49cc;
                sVar26 = duckdb_je_batcher_pop_begin((tsdn_t *)paVar34,(batcher_t *)peVar37);
                ppVar38 = local_38;
                if (sVar26 != 0xffffffffffffffff) {
                  *(undefined8 *)(lVar24 + -8) = 0x11a49e4;
                  local_98 = duckdb_je_batcher_pop_get_pushes
                                       ((tsdn_t *)paVar34,(batcher_t *)peVar37);
                  ppVar38 = local_38;
                  if (sVar26 != 0) {
                    lVar31 = 0;
                    sVar28 = sVar26;
                    do {
                      puVar27 = (undefined8 *)((long)ppVar38 + lVar31 + 0x188);
                      uVar12 = puVar27[1];
                      *(undefined8 *)((long)remote_free_data + lVar31 + -8) = *puVar27;
                      *(undefined8 *)((long)&remote_free_data[0].ptr + lVar31) = uVar12;
                      lVar31 = lVar31 + 0x10;
                      sVar28 = sVar28 - 1;
                    } while (sVar28 != 0);
                  }
                  *(undefined8 *)(lVar24 + -8) = 0x11a4a1f;
                  batcher_pop_end((tsdn_t *)paVar34,(batcher_t *)peVar37);
                  ppVar38 = local_38;
                  if (sVar26 != 0) {
                    pbVar33 = remote_free_data;
                    sVar28 = sVar26;
                    uVar42 = local_54;
                    do {
                      paVar34 = lstats;
                      paVar39 = local_60;
                      peVar44 = (edata_t *)pbVar33->ptr;
                      uVar32 = ((long)pbVar33[-1].slab - (long)peVar44->e_addr) * (long)local_68;
                      puVar5 = (ulong *)((long)&peVar44->field_6 + (uVar32 >> 0x26) * 8);
                      *puVar5 = *puVar5 ^ 1L << ((byte)(uVar32 >> 0x20) & 0x3f);
                      uVar32 = peVar44->e_bits + 0x10000000;
                      peVar44->e_bits = uVar32;
                      uVar22 = (uint)(uVar32 >> 0x1c) & 0x3ff;
                      if (uVar22 == duckdb_je_bin_infos[uVar46].nregs) {
                        *(undefined8 *)(lVar24 + -8) = 0x11a4a9b;
                        duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                                  ((tsdn_t *)paVar34,paVar39,peVar44,(bin_t *)&ppVar38->__data);
                        ppVar38 = local_38;
                        if (uVar42 < (uint)local_78) {
                          *(edata_t **)(local_b0 + (ulong)uVar42 * 8) = peVar44;
                          uVar42 = uVar42 + 1;
                        }
                        else {
                          (peVar44->field_5).ql_link_active.qre_next = peVar44;
                          (peVar44->field_5).ql_link_active.qre_prev = peVar44;
                          if (local_50 != (edata_t *)0x0) {
                            (peVar44->field_5).ql_link_active.qre_next =
                                 (local_50->field_5).ql_link_active.qre_prev;
                            (local_50->field_5).ql_link_active.qre_prev = peVar44;
                            (peVar44->field_5).ql_link_active.qre_prev =
                                 (((peVar44->field_5).ql_link_active.qre_prev)->field_5).
                                 ql_link_active.qre_next;
                            (((local_50->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                            qre_next = local_50;
                            (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                            qre_next = peVar44;
                          }
                          local_50 = (peVar44->field_5).ql_link_active.qre_next;
                        }
                      }
                      else if ((uVar22 == 1) &&
                              (((emap_batch_lookup_result_t *)((long)ppVar38 + 0xe0))->edata !=
                               peVar44)) {
                        *(undefined8 *)(lVar24 + -8) = 0x11a4ad5;
                        duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                                  ((tsdn_t *)paVar34,paVar39,peVar44,(bin_t *)&ppVar38->__data);
                        ppVar38 = local_38;
                      }
                      pbVar33 = pbVar33 + 1;
                      sVar28 = sVar28 - 1;
                    } while (sVar28 != 0);
                    lVar40 = lVar40 + sVar26;
                    paVar34 = lstats;
                    local_54 = uVar42;
                  }
                  ((emap_batch_lookup_result_t *)((long)ppVar38 + 0xc0))->edata =
                       (edata_t *)
                       ((long)&((emap_batch_lookup_result_t *)((long)ppVar38 + 0xc0))->edata->e_bits
                       + 1);
                  ((emap_batch_lookup_result_t *)((long)ppVar38 + 0xd0))->edata =
                       (edata_t *)
                       ((long)&((emap_batch_lookup_result_t *)((long)ppVar38 + 0xd0))->edata->e_bits
                       + local_98);
                  ((emap_batch_lookup_result_t *)((long)ppVar38 + 0xd8))->edata =
                       (edata_t *)
                       ((long)&((emap_batch_lookup_result_t *)((long)ppVar38 + 0xd8))->edata->e_bits
                       + sVar26);
                  uVar22 = local_6c;
                }
              }
              peVar44 = local_50;
              ppVar38[3].__align = (long)((long)&((edata_t *)ppVar38[3].__align)->e_bits + lVar40);
              ((emap_batch_lookup_result_t *)((long)ppVar38 + 0x88))->edata =
                   (edata_t *)
                   ((long)((emap_batch_lookup_result_t *)((long)ppVar38 + 0x88))->edata - lVar40);
              *(undefined1 *)((long)ppVar38 + 0x40) = 0;
              ppVar38 = (pthread_mutex_t *)((long)ppVar38 + 0x48);
              *(undefined8 *)(lVar24 + -8) = 0x11a4b8f;
              pthread_mutex_unlock(ppVar38);
            }
            uVar42 = uVar22;
            paVar39 = local_60;
            if (paVar34 != (arena_stats_large_t *)0x0) {
              cVar8 = ((tsd_t *)&paVar34->nmalloc)->
                      cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
              ptVar3 = (ticker_geom_t *)&paVar34[3].ndalloc;
              ptVar3->tick = ptVar3->tick - (int)local_a8;
              if (ptVar3->tick < 0) {
                if (cVar8 < '\x01') {
                  uVar32 = paVar34[2].nrequests.val.repr * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
                  paVar34[2].nrequests.val.repr = uVar32;
                  ((ticker_geom_t *)&paVar34[3].ndalloc)->tick =
                       (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar32 >> 0x3a] *
                                 (long)((ticker_geom_t *)&paVar34[3].ndalloc)->nticks) / 0x3d);
                  *(undefined8 *)(lVar24 + -8) = 0x11a4c4d;
                  duckdb_je_arena_decay((tsdn_t *)paVar34,paVar39,false,false);
                }
                else {
                  ((ticker_geom_t *)&paVar34[3].ndalloc)->tick = 0;
                }
              }
            }
            uVar22 = local_54;
            local_50 = peVar44;
          } while (uVar42 < (uint)local_78);
        }
        tsd = (tsd_t *)lstats;
        lVar40 = local_b0;
        cache_bin = local_90;
        paVar39 = local_80;
        sVar16 = local_70;
        peVar44 = local_50;
        if (uVar22 != 0) {
          uVar32 = 0;
          do {
            peVar44 = *(edata_t **)(lVar40 + uVar32 * 8);
            paVar39 = (arena_t *)duckdb_je_arenas[(uint)peVar44->e_bits & 0xfff].repr;
            *(undefined8 *)(lVar24 + -8) = 0x11a4cd2;
            duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar39,peVar44);
            uVar32 = uVar32 + 1;
            cache_bin = local_90;
            paVar39 = local_80;
            sVar16 = local_70;
            peVar44 = local_50;
          } while (uVar22 != uVar32);
        }
        while (local_90 = cache_bin, local_80 = paVar39, local_70 = sVar16,
              peVar44 != (edata_t *)0x0) {
          peVar35 = (peVar44->field_5).ql_link_active.qre_next;
          if (peVar35 == peVar44) {
            peVar35 = (edata_t *)0x0;
          }
          else {
            (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 (((peVar44->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
            (((peVar44->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
                 (peVar44->field_5).ql_link_active.qre_prev;
            peVar15 = (peVar44->field_5).ql_link_active.qre_next;
            (peVar44->field_5).ql_link_active.qre_prev =
                 (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
            (((peVar15->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 peVar15;
            (((peVar44->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 peVar44;
          }
          paVar39 = (arena_t *)duckdb_je_arenas[(uint)peVar44->e_bits & 0xfff].repr;
          *(undefined8 *)(lVar24 + -8) = 0x11a4d4b;
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar39,peVar44);
          cache_bin = local_90;
          paVar39 = local_80;
          sVar16 = local_70;
          peVar44 = peVar35;
        }
        if ((local_88 & 1) == 0) {
          *(undefined8 *)(lVar24 + -8) = 0x11a4d71;
          mutex = duckdb_je_arena_bin_choose((tsdn_t *)tsd,paVar39,sVar16,(uint *)0x0);
          ppVar29 = (pthread_mutex_t *)((long)&(mutex->lock).field_0 + 0x48);
          *(undefined8 *)(lVar24 + -8) = 0x11a4d83;
          iVar23 = pthread_mutex_trylock(ppVar29);
          if (iVar23 != 0) {
            *(undefined8 *)(lVar24 + -8) = 0x11a4d8f;
            duckdb_je_malloc_mutex_lock_slow(&mutex->lock);
            (mutex->lock).field_0.field_0.locked.repr = true;
          }
          tsd = (tsd_t *)lstats;
          cache_bin = local_90;
          puVar4 = &(mutex->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar4 = *puVar4 + 1;
          if ((arena_stats_large_t *)(mutex->lock).field_0.field_0.prof_data.prev_owner != lstats) {
            (mutex->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)lstats;
            ppwVar1 = &(mutex->lock).field_0.witness.link.qre_prev;
            *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
          }
          puVar4 = &(mutex->stats).nflushes;
          *puVar4 = *puVar4 + 1;
          puVar4 = &(mutex->stats).nrequests;
          *puVar4 = *puVar4 + (local_90->tstats).nrequests;
          (local_90->tstats).nrequests = 0;
          (mutex->lock).field_0.field_0.locked.repr = false;
          *(undefined8 *)(lVar24 + -8) = 0x11a4dd9;
          pthread_mutex_unlock(ppVar29);
        }
      }
      else {
        lVar24 = -((ulong)uVar42 * 8 + 0x17 & 0xfffffffffffffff0);
        ppVar29 = (pthread_mutex_t *)((long)remote_free_data + lVar24 + -8);
        local_38 = ppVar29;
        *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a4311;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_c0,uVar42,(size_t)ppVar29,(emap_batch_lookup_result_t *)ppVar38);
        if (uVar45 != uVar41) {
          local_50 = (edata_t *)((long)local_80 + (uVar46 - 0x24) * 0x30 + 0x3e0);
          local_60 = (arena_t *)((ulong)local_60 & 0xffffffff00000000);
          uVar32 = local_78 & 0xffffffff;
          ppVar29 = local_38;
          do {
            local_68 = (emap_batch_lookup_result_t *)CONCAT44(local_68._4_4_,(int)uVar32);
            uVar42 = (uint)(*(edata_t **)ppVar29)->e_bits & 0xfff;
            paVar39 = (arena_t *)duckdb_je_arenas[uVar42].repr;
            if (paVar39 == (arena_t *)0x0) {
              paVar39 = (arena_t *)0x0;
            }
            if (duckdb_je_manual_arena_base <= paVar39->ind) {
              *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a4391;
              iVar23 = pthread_mutex_trylock
                                 ((pthread_mutex_t *)((long)&(paVar39->large_mtx).field_0 + 0x48));
              if (iVar23 != 0) {
                *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a43a1;
                duckdb_je_malloc_mutex_lock_slow(&paVar39->large_mtx);
                (paVar39->large_mtx).field_0.field_0.locked.repr = true;
              }
              puVar4 = &(paVar39->large_mtx).field_0.field_0.prof_data.n_lock_ops;
              *puVar4 = *puVar4 + 1;
              ppVar29 = local_38;
              if (&((paVar39->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
                *(tsd_t **)((long)&(paVar39->large_mtx).field_0 + 0x30) = tsd;
                ppwVar1 = &(paVar39->large_mtx).field_0.witness.link.qre_prev;
                *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
              }
            }
            if ((local_80 == paVar39) && (((ulong)local_60 & 1) == 0)) {
              uVar14 = (cache_bin->tstats).nrequests;
              LOCK();
              (local_50->field_2).e_size_esn = (local_50->field_2).e_size_esn + uVar14;
              UNLOCK();
              LOCK();
              local_50->e_sn = local_50->e_sn + 1;
              UNLOCK();
              (cache_bin->tstats).nrequests = 0;
              local_60 = (arena_t *)CONCAT44(local_60._4_4_,(int)CONCAT71((int7)(uVar14 >> 8),1));
            }
            uVar30 = (ulong)((int)local_68 + (uint)((int)local_68 == 0));
            uVar32 = 0;
            local_40 = paVar39;
            do {
              peVar44 = ((emap_batch_lookup_result_t *)((long)ppVar29 + uVar32 * 8))->edata;
              if (((uint)peVar44->e_bits & 0xfff) == uVar42) {
                *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a441f;
                duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar44);
                ppVar29 = local_38;
              }
              uVar32 = uVar32 + 1;
            } while (uVar30 != uVar32);
            if (duckdb_je_manual_arena_base <= local_40->ind) {
              (local_40->large_mtx).field_0.field_0.locked.repr = false;
              pmVar17 = &local_40->large_mtx;
              *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a4457;
              pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar17->field_0 + 0x48));
              ppVar29 = local_38;
            }
            ppvVar18 = local_c0.ptr;
            uVar25 = 0;
            uVar32 = 0;
            do {
              paVar34 = lstats;
              peVar44 = ((emap_batch_lookup_result_t *)((long)ppVar29 + uVar25 * 8))->edata;
              if (((uint)peVar44->e_bits & 0xfff) == uVar42) {
                *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a4483;
                duckdb_je_large_dalloc_finish((tsdn_t *)paVar34,peVar44);
                ppVar29 = local_38;
              }
              else {
                ppvVar18[uVar32] = ppvVar18[uVar25];
                ((emap_batch_lookup_result_t *)((long)ppVar29 + uVar32 * 8))->edata = peVar44;
                uVar32 = (ulong)((int)uVar32 + 1);
              }
              paVar39 = local_40;
              tsd = (tsd_t *)lstats;
              cache_bin = local_90;
              uVar25 = uVar25 + 1;
            } while (uVar30 != uVar25);
            if (lstats != (arena_stats_large_t *)0x0) {
              cVar8 = *(char *)((long)&(lstats->nmalloc).val.repr + 1);
              plVar2 = &lstats[3].ndalloc;
              *(int *)&(plVar2->val).repr = (int)(plVar2->val).repr + ((int)uVar32 - (int)local_68);
              if ((int)(plVar2->val).repr < 0) {
                if (cVar8 < '\x01') {
                  uVar30 = lstats[2].nrequests.val.repr * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
                  lstats[2].nrequests.val.repr = uVar30;
                  *(int *)&lstats[3].ndalloc.val.repr =
                       (int)(((ulong)duckdb_je_ticker_geom_table[uVar30 >> 0x3a] *
                             (long)*(int *)((long)&lstats[3].ndalloc.val.repr + 4)) / 0x3d);
                  *(undefined8 *)((long)&uStack_220 + lVar24) = 0x11a455e;
                  duckdb_je_arena_decay((tsdn_t *)tsd,paVar39,false,false);
                  ppVar29 = local_38;
                }
                else {
                  *(undefined4 *)&lstats[3].ndalloc.val.repr = 0;
                }
              }
            }
          } while ((int)uVar32 != 0);
          if (((ulong)local_60 & 1) != 0) goto LAB_011a4ddc;
        }
        lVar24 = (uVar46 - 0x24) * 0x30;
        LOCK();
        plVar6 = (long *)((long)local_80 + lVar24 + 0x3f0);
        *plVar6 = *plVar6 + (cache_bin->tstats).nrequests;
        UNLOCK();
        LOCK();
        plVar6 = (long *)((long)local_80 + lVar24 + 0x400);
        *plVar6 = *plVar6 + 1;
        UNLOCK();
        (cache_bin->tstats).nrequests = 0;
      }
LAB_011a4ddc:
      uVar32 = (ulong)(uVar41 + (uint)local_78);
    } while (uVar41 + (uint)local_78 < uVar45);
    uVar10 = cache_bin->low_bits_empty;
    cache_bin->low_bits_full = uVar10 + (cache_bin->bin_info).ncached_max * -8;
  }
  return;
}

Assistant:

void
tcache_bin_flush_stashed(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, bool is_small) {
	assert(!tcache_bin_disabled(binind, cache_bin, tcache->tcache_slow));
	/*
	 * The two below are for assertion only.  The content of original cached
	 * items remain unchanged -- the stashed items reside on the other end
	 * of the stack.  Checking the stack head and ncached to verify.
	 */
	void *head_content = *cache_bin->stack_head;
	cache_bin_sz_t orig_cached = cache_bin_ncached_get_local(cache_bin);

	cache_bin_sz_t nstashed = cache_bin_nstashed_get_local(cache_bin);
	assert(orig_cached + nstashed <= cache_bin_ncached_max_get(cache_bin));
	if (nstashed == 0) {
		return;
	}

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nstashed);
	cache_bin_init_ptr_array_for_stashed(cache_bin, binind, &ptrs,
	    nstashed);
	san_check_stashed_ptrs(ptrs.ptr, nstashed, sz_index2size(binind));
	tcache_bin_flush_impl(tsd, tcache, cache_bin, binind, &ptrs, nstashed,
	    is_small);
	cache_bin_finish_flush_stashed(cache_bin);

	assert(cache_bin_nstashed_get_local(cache_bin) == 0);
	assert(cache_bin_ncached_get_local(cache_bin) == orig_cached);
	assert(head_content == *cache_bin->stack_head);
}